

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ggwave.cpp
# Opt level: O1

void convert<signed_char,short>(vector<unsigned_char,_std::allocator<unsigned_char>_> *src)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uchar uVar4;
  uint uVar5;
  long lVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  size_type __new_size;
  vector<short,_std::allocator<short>_> dst;
  key_type local_70;
  ulong local_68;
  key_type local_60;
  key_type local_58;
  key_type local_50;
  vector<short,_std::allocator<short>_> local_48;
  
  lVar6 = (long)(src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar5 = (uint)lVar6;
  std::vector<short,_std::allocator<short>_>::vector
            (&local_48,(long)(int)uVar5,(allocator_type *)&local_70);
  if (0 < (int)uVar5) {
    local_68 = (ulong)(uVar5 & 0x7fffffff);
    uVar8 = 0;
    do {
      uVar4 = (src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      local_70._M_target = (type_info *)&signed_char::typeinfo;
      pmVar7 = std::
               map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
               ::at(&kSampleOffset,&local_70);
      fVar1 = *pmVar7;
      local_50._M_target = (type_info *)&signed_char::typeinfo;
      pmVar7 = std::
               map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
               ::at(&kSampleScale,&local_50);
      fVar2 = *pmVar7;
      local_58._M_target = (type_info *)&short::typeinfo;
      pmVar7 = std::
               map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
               ::at(&kSampleScale,&local_58);
      fVar3 = *pmVar7;
      local_60._M_target = (type_info *)&short::typeinfo;
      pmVar7 = std::
               map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
               ::at(&kSampleOffset,&local_60);
      local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8] = (short)(int)((((float)(int)(char)uVar4 - fVar1) / fVar2) * fVar3 + *pmVar7);
      uVar8 = uVar8 + 1;
    } while (local_68 != uVar8);
  }
  __new_size = (lVar6 << 0x20) >> 0x1f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(src,__new_size);
  memcpy((src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start,
         local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
         _M_start,__new_size);
  if (local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void convert(std::vector<uint8_t> & src) {
    const int n = src.size()/sizeof(S);
    std::vector<D> dst(n);
    S v;
    for (int i = 0; i < n; ++i) {
        std::memcpy(&v, &src[i*sizeof(S)], sizeof(S));
        dst[i] = ((float(v) - kSampleOffset.at(typeid(S)))/kSampleScale.at(typeid(S)))*kSampleScale.at(typeid(D)) + kSampleOffset.at(typeid(D));
    }

    src.resize(n*sizeof(D));
    std::memcpy(&src[0], &dst[0], n*sizeof(D));
}